

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double __thiscall IF97::Region3::speed_sound(Region3 *this,double T,double rho)

{
  uint uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double ans;
  
  dVar3 = delta_dphi_ddelta(this,T,rho);
  dVar4 = delta2_d2phi_ddelta2(this,T,rho);
  dVar5 = delta_dphi_ddelta(this,T,rho);
  dVar6 = deltatau_d2phi_ddelta_dtau(this,T,rho);
  dVar5 = dVar5 - dVar6;
  uVar2 = 2;
  dVar6 = 1.0;
  do {
    if ((uVar2 & 1) != 0) {
      dVar6 = dVar6 * dVar5;
    }
    dVar5 = dVar5 * dVar5;
    uVar1 = (uint)uVar2;
    uVar2 = uVar2 >> 1;
  } while (1 < uVar1);
  dVar5 = tau2_d2phi_dtau2(this,T,rho);
  dVar3 = this->R * 1000.0 * T * ((dVar3 + dVar3 + dVar4) - dVar6 / dVar5);
  if (0.0 <= dVar3) {
    return SQRT(dVar3);
  }
  dVar3 = sqrt(dVar3);
  return dVar3;
}

Assistant:

double speed_sound(double T, double rho) const{
            const double RHS = 2*delta_dphi_ddelta(T, rho) + delta2_d2phi_ddelta2(T, rho)-powi(delta_dphi_ddelta(T,rho)-deltatau_d2phi_ddelta_dtau(T,rho),2)/tau2_d2phi_dtau2(T,rho);
            return sqrt(R*(1000/R_fact)*T*RHS);
        }